

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::constraintJacobianWRTState
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *param_4,
          MatrixDynSize *jacobian)

{
  int iVar1;
  size_t sVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  MatrixDynSize *in_RCX;
  Constraint *in_RDI;
  double in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *stateConstraintMatrix;
  bool isValid;
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  MatrixDynSize *local_40;
  byte local_31;
  MatrixDynSize *local_30;
  double local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_18 = in_XMM0_Qa;
  sVar2 = Constraint::constraintSize(in_RDI);
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)in_RCX,sVar2 & 0xffffffff);
  if (((ulong)*in_RDI[1]._vptr_Constraint & 1) == 0) {
    iDynTree::MatrixDynSize::zero();
  }
  else {
    local_31 = 0;
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x37ec37);
    iVar1 = (*peVar3->_vptr_TimeVaryingObject[2])(local_18,peVar3,&local_31);
    local_40 = (MatrixDynSize *)CONCAT44(extraout_var,iVar1);
    if ((local_31 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar4 = std::operator<<((ostream *)local_1b8,
                               "Unable to retrieve a valid state constraint matrix at time: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
      std::operator<<(poVar4,".");
      Constraint::name_abi_cxx11_(in_RDI);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar5,"constraintJacobianWRTState",pcVar6);
      std::__cxx11::string::~string(local_1e8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      goto LAB_0037ef12;
    }
    lVar7 = iDynTree::MatrixDynSize::cols();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 == lVar8) {
      sVar2 = iDynTree::MatrixDynSize::rows();
      sVar9 = Constraint::constraintSize(in_RDI);
      if (sVar2 != sVar9) goto LAB_0037ede1;
    }
    else {
LAB_0037ede1:
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar4 = std::operator<<((ostream *)local_360,"The state constraint matrix at time: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
      std::operator<<(poVar4,
                      " has dimensions not matching with the specified state space dimension or constraint dimension."
                     );
      Constraint::name_abi_cxx11_(in_RDI);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar5,"constraintJacobianWRTState",pcVar6);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
    }
    iDynTree::MatrixDynSize::operator=(local_30,local_40);
  }
  local_1 = 1;
LAB_0037ef12:
  return (bool)(local_1 & 1);
}

Assistant:

bool LinearConstraint::constraintJacobianWRTState(double time,
                                                const VectorDynSize& state,
                                                const VectorDynSize& /*control*/,
                                                MatrixDynSize& jacobian)
        {
            jacobian.resize(static_cast<unsigned int>(constraintSize()), state.size());

            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "constraintJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "constraintJacobianWRTState", errorMsg.str().c_str());
                }

                jacobian = stateConstraintMatrix;
            } else {
                jacobian.zero();
            }

            return true;
        }